

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O1

void rouse_shk(monst *shkp,boolean verbosely)

{
  uint uVar1;
  boolean bVar2;
  int iVar3;
  obj *poVar4;
  char *pcVar5;
  char *pcVar6;
  
  if ((*(uint *)&shkp->field_0x60 & 0xc0000) == 0x40000) {
    return;
  }
  if (verbosely == '\0') goto LAB_0023c38f;
  if (shkp->wormno == '\0') {
    if (((viz_array[shkp->my][shkp->mx] & 2U) == 0) &&
       (((((u.uprops[0x1e].intrinsic != 0 ||
           (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
            (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
          ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
         ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0 &&
          (((youmonst.data)->mflags3 & 0x100) == 0)))) ||
        (((viz_array[shkp->my][shkp->mx] & 1U) == 0 || ((shkp->data->mflags3 & 0x200) == 0))))))
    goto LAB_0023c1fb;
LAB_0023c1a6:
    uVar1 = *(uint *)&shkp->field_0x60;
    if (((uVar1 & 2) != 0) && ((u.uprops[0xc].intrinsic == 0 && (u.uprops[0xc].extrinsic == 0)))) {
      if (((uVar1 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
      goto LAB_0023c1ee;
      goto LAB_0023c1fb;
    }
    if ((uVar1 & 0x280) != 0) goto LAB_0023c1fb;
LAB_0023c1ee:
    if ((u._1052_1_ & 0x20) != 0) goto LAB_0023c1fb;
  }
  else {
    bVar2 = worm_known(level,shkp);
    if (bVar2 != '\0') goto LAB_0023c1a6;
LAB_0023c1fb:
    if (((shkp->data->mflags1 & 0x10000) == 0) &&
       ((poVar4 = which_armor(shkp,4), poVar4 == (obj *)0x0 ||
        (poVar4 = which_armor(shkp,4), poVar4->otyp != 0x4f)))) {
      if (((u.uprops[0x1e].intrinsic == 0) &&
          (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
           (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
         (((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
          ((((youmonst.data != mons + 0x31 && youmonst.data != mons + 0x1e) &&
            (u.uprops[0x19].extrinsic == 0 && u.uprops[0x19].intrinsic == 0)) &&
            youmonst.data != mons + 0x32 || (u.uprops[0x19].blocked != 0)))))) {
        if ((u.uprops[0x19].extrinsic == 0) || (u.uprops[0x19].blocked != 0)) goto LAB_0023c333;
        iVar3 = dist2((int)shkp->mx,(int)shkp->my,(int)u.ux,(int)u.uy);
        if ((iVar3 < 0x41) || (u.uprops[0x42].intrinsic != 0)) goto LAB_0023c35f;
        goto LAB_0023c343;
      }
    }
    else {
LAB_0023c333:
      if (u.uprops[0x42].intrinsic == 0) {
LAB_0023c343:
        if ((u.uprops[0x42].extrinsic == 0) && (bVar2 = match_warn_of_mon(shkp), bVar2 == '\0'))
        goto LAB_0023c38f;
      }
    }
  }
LAB_0023c35f:
  pcVar5 = Monnam(shkp);
  pcVar6 = "wakes up";
  if ((*(uint *)&shkp->field_0x60 >> 0x13 & 1) == 0) {
    pcVar6 = "can move again";
  }
  pline("%s %s.",pcVar5,pcVar6);
LAB_0023c38f:
  shkp->mfrozen = '\0';
  *(uint *)&shkp->field_0x60 = *(uint *)&shkp->field_0x60 & 0xfff3ffff | 0x40000;
  return;
}

Assistant:

static void rouse_shk(struct monst *shkp, boolean verbosely)
{
	if (!shkp->mcanmove || shkp->msleeping) {
	    /* greed induced recovery... */
	    if (verbosely && canspotmon(level, shkp))
		pline("%s %s.", Monnam(shkp),
		      shkp->msleeping ? "wakes up" : "can move again");
	    shkp->msleeping = 0;
	    shkp->mfrozen = 0;
	    shkp->mcanmove = 1;
	}
}